

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::InitializeDebugging(ScriptContext *this)

{
  bool bVar1;
  DebugContext *this_00;
  
  bVar1 = IsScriptContextInDebugMode(this);
  if (!bVar1) {
    this_00 = GetDebugContext(this);
    DebugContext::SetDebuggerMode(this_00,Debugging);
    bVar1 = IsScriptContextInDebugMode(this);
    if (bVar1) {
      RegisterDebugThunk(this,false);
      return;
    }
  }
  return;
}

Assistant:

void ScriptContext::InitializeDebugging()
    {
        if (!this->IsScriptContextInDebugMode()) // If we already in debug mode, we would have done below changes already.
        {
            this->GetDebugContext()->SetDebuggerMode(Js::DebuggerMode::Debugging);
            if (this->IsScriptContextInDebugMode())
            {
                // Note: for this we need final IsInDebugMode and NativeCodeGen initialized,
                //       and inside EnsureScriptContext, which seems appropriate as well,
                //       it's too early as debugger manager is not registered, thus IsDebuggerEnvironmentAvailable is false.
                this->RegisterDebugThunk(false/*calledDuringAttach*/);

                // TODO: for launch scenario for external and WinRT functions it might be too late to register debug thunk here,
                //       as we need the thunk registered before FunctionInfo's for built-ins, that may throw, are created.
                //       Need to verify. If that's the case, one way would be to enumerate and fix all external/winRT thunks here.
            }
        }
    }